

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterAllocation.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getOriginalTemps_abi_cxx11_
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,AssemblyCommands *commands)

{
  bool bVar1;
  reference psVar2;
  element_type *peVar3;
  reference pCVar4;
  CTemp local_c8;
  undefined1 local_a8 [8];
  CTemp temp;
  iterator __end2;
  iterator __begin2;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_68;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *local_50;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__range2;
  shared_ptr<AssemblyCode::AssemblyCommand> command;
  iterator __end1;
  iterator __begin1;
  AssemblyCommands *__range1;
  AssemblyCommands *commands_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *temps;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  __end1 = std::
           vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
           ::begin(commands);
  command.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
          ::end(commands);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
                                     *)&command.
                                        super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)&__range2,psVar2);
    peVar3 = std::
             __shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range2);
    (*peVar3->_vptr_AssemblyCommand[1])(&local_68);
    local_50 = &local_68;
    __end2 = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::begin(local_50);
    temp._24_8_ = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::end(local_50);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
                                       *)&temp.field_0x18), bVar1) {
      pCVar4 = __gnu_cxx::
               __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
               ::operator*(&__end2);
      IRT::CTemp::CTemp((CTemp *)local_a8,pCVar4);
      IRT::CTemp::ToString_abi_cxx11_(&local_c8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(__return_storage_ptr__,&local_c8.name);
      std::__cxx11::string::~string((string *)&local_c8);
      IRT::CTemp::~CTemp((CTemp *)local_a8);
      __gnu_cxx::
      __normal_iterator<IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>::
      operator++(&__end2);
    }
    std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_68);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<AssemblyCode::AssemblyCommand>_*,_std::vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> getOriginalTemps(AssemblyCommands& commands) {
    std::set<std::string> temps;
    for (auto command : commands) {
        for (auto temp : command->GetOut()) {
            temps.insert(temp.ToString());
        }
    }

    return temps;
}